

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tick.h
# Opt level: O1

void __thiscall Tick::Tick(Tick *this,microseconds timeBetweenTicks,function<void_()> *onTick)

{
  undefined8 uVar1;
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  *(undefined8 *)&(this->onTick_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onTick_).super__Function_base._M_functor + 8) = 0;
  (this->onTick_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onTick_)._M_invoker = onTick->_M_invoker;
  if ((onTick->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(onTick->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->onTick_).super__Function_base._M_functor =
         *(undefined8 *)&(onTick->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->onTick_).super__Function_base._M_functor + 8) = uVar1;
    (this->onTick_).super__Function_base._M_manager = (onTick->super__Function_base)._M_manager;
    (onTick->super__Function_base)._M_manager = (_Manager_type)0x0;
    onTick->_M_invoker = (_Invoker_type)0x0;
  }
  (this->timeBetweenTicks_).__r = timeBetweenTicks.__r;
  (this->active_)._M_base._M_i = true;
  local_18.this = this;
  std::thread::
  thread<Tick::Tick(std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>&&)::_lambda()_1_,,void>
            (&this->timerThread_,&local_18);
  return;
}

Assistant:

Tick(std::chrono::microseconds timeBetweenTicks,
         std::function<void()>&& onTick)
        : timeBetweenTicks_(timeBetweenTicks)
        , onTick_(std::move(onTick))
        , active_(true)
        , timerThread_([this] { Loop(); }) // note initialization order is very important here; 
                                            // thread should start last
    {}